

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

int __thiscall CTcGenTarg::add_meta(CTcGenTarg *this,char *nm,size_t len,CTcSymMetaclass *sym)

{
  int iVar1;
  long lVar2;
  tc_meta_entry *ptVar3;
  ulong uVar4;
  tc_meta_entry *ptVar5;
  char *__n;
  char *local_40;
  
  lVar2 = 0;
  __n = (char *)0x7;
  do {
    uVar4 = len - lVar2;
    if (uVar4 == 0) {
      local_40 = "/000000";
LAB_0020a8f0:
      ptVar3 = (tc_meta_entry *)malloc((size_t)(__n + len + 0x18));
      if (ptVar3 == (tc_meta_entry *)0x0) {
        err_throw(0x2cec);
      }
      memcpy(ptVar3->nm,nm,len);
      if (__n != (char *)0x0) {
        memcpy(ptVar3->nm + len,local_40,(size_t)__n);
      }
      __n[(long)(ptVar3->nm + len)] = '\0';
      ptVar3->sym = sym;
      ptVar3->nxt = (tc_meta_entry *)0x0;
      ptVar5 = (tc_meta_entry *)&this->meta_head_;
      if (this->meta_tail_ != (tc_meta_entry *)0x0) {
        ptVar5 = this->meta_tail_;
      }
      ptVar5->nxt = ptVar3;
      this->meta_tail_ = ptVar3;
      iVar1 = this->meta_cnt_;
      this->meta_cnt_ = iVar1 + 1;
      return iVar1;
    }
    if (nm[lVar2] == '/') {
      __n = (char *)(7 - uVar4);
      if (7 < uVar4) {
        __n = (char *)0x0;
      }
      local_40 = "000000";
      if (6 < uVar4) {
        local_40 = (char *)0x0;
      }
      goto LAB_0020a8f0;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int CTcGenTarg::add_meta(const char *nm, size_t len,
                         CTcSymMetaclass *sym)
{
    tc_meta_entry *ent;
    size_t extra_len;
    const char *extra_ptr;
    const char *p;
    size_t rem;

    /* 
     *   if the name string doesn't contain a slash, allocate enough space
     *   to add an implied version suffix of "/000000" 
     */
    for (p = nm, rem = len ; rem != 0 && *p != '/' ; ++p, --rem) ;
    if (rem == 0)
    {
        /* we didn't find a version suffix - add space for one */
        extra_len = 7;
        extra_ptr = "/000000";
    }
    else
    {
        /* 
         *   there's already a version suffix - but make sure we have
         *   space for a six-character string 
         */
        if (rem < 7)
        {
            /* add zeros to pad out to a six-place version string */
            extra_len = 7 - rem;
            extra_ptr = "000000";
        }
        else
        {
            /* we need nothing extra */
            extra_len = 0;
            extra_ptr = 0;
        }
    }
    
    /* allocate a new entry for the item */
    ent = (tc_meta_entry *)t3malloc(sizeof(tc_meta_entry) + len + extra_len);
    if (ent == 0)
        err_throw(TCERR_CODEGEN_NO_MEM);

    /* copy the name into the entry */
    memcpy(ent->nm, nm, len);

    /* add any extra version suffix information */
    if (extra_len != 0)
        memcpy(ent->nm + len, extra_ptr, extra_len);

    /* null-terminate the name string in the entry */
    ent->nm[len + extra_len] = '\0';

    /* remember the symbol */
    ent->sym = sym;

    /* link the entry in at the end of the list */
    ent->nxt = 0;
    if (meta_tail_ != 0)
        meta_tail_->nxt = ent;
    else
        meta_head_ = ent;
    meta_tail_ = ent;

    /* count the entry, returning the index of the entry in the list */
    return meta_cnt_++;
}